

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxMorph::~PmxMorph(PmxMorph *this)

{
  PmxMorph *this_local;
  
  std::unique_ptr<pmx::PmxMorphImplusOffset[],_std::default_delete<pmx::PmxMorphImplusOffset[]>_>::
  ~unique_ptr(&this->implus_offsets);
  std::unique_ptr<pmx::PmxMorphFlipOffset[],_std::default_delete<pmx::PmxMorphFlipOffset[]>_>::
  ~unique_ptr(&this->flip_offsets);
  std::unique_ptr<pmx::PmxMorphGroupOffset[],_std::default_delete<pmx::PmxMorphGroupOffset[]>_>::
  ~unique_ptr(&this->group_offsets);
  std::
  unique_ptr<pmx::PmxMorphMaterialOffset[],_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>::
  ~unique_ptr(&this->material_offsets);
  std::unique_ptr<pmx::PmxMorphBoneOffset[],_std::default_delete<pmx::PmxMorphBoneOffset[]>_>::
  ~unique_ptr(&this->bone_offsets);
  std::unique_ptr<pmx::PmxMorphUVOffset[],_std::default_delete<pmx::PmxMorphUVOffset[]>_>::
  ~unique_ptr(&this->uv_offsets);
  std::unique_ptr<pmx::PmxMorphVertexOffset[],_std::default_delete<pmx::PmxMorphVertexOffset[]>_>::
  ~unique_ptr(&this->vertex_offsets);
  std::__cxx11::string::~string((string *)&this->morph_english_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PmxMorph()
			: offset_count(0)
		{
		}